

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void change_inline_insn_regs(MIR_context_t ctx,MIR_insn_t_conflict new_insn)

{
  char cVar1;
  MIR_reg_t MVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  sVar3 = MIR_insn_nops(ctx,new_insn);
  for (lVar5 = 0; sVar3 * 0x30 - lVar5 != 0; lVar5 = lVar5 + 0x30) {
    cVar1 = (&new_insn->ops[0].field_0x8)[lVar5];
    if (cVar1 == '\n') {
      uVar4 = (ulong)*(uint *)((long)&new_insn->ops[0].u + lVar5 + 0x10);
      if (uVar4 != 0) {
        MVar2 = VARR_MIR_reg_tget(ctx->simplify_ctx->inline_reg_map,uVar4);
        *(MIR_reg_t *)((long)&new_insn->ops[0].u + lVar5 + 0x10) = MVar2;
      }
      uVar4 = (ulong)*(uint *)((long)&new_insn->ops[0].u + lVar5 + 0x14);
      if (uVar4 != 0) {
        MVar2 = VARR_MIR_reg_tget(ctx->simplify_ctx->inline_reg_map,uVar4);
        *(MIR_reg_t *)((long)&new_insn->ops[0].u + lVar5 + 0x14) = MVar2;
      }
    }
    else if (cVar1 == '\x01') {
      MVar2 = VARR_MIR_reg_tget(ctx->simplify_ctx->inline_reg_map,
                                (ulong)*(uint *)((long)&new_insn->ops[0].u + lVar5));
      *(MIR_reg_t *)((long)&new_insn->ops[0].u + lVar5) = MVar2;
    }
  }
  return;
}

Assistant:

static void change_inline_insn_regs (MIR_context_t ctx, MIR_insn_t new_insn) {
  size_t i, actual_nops;
  actual_nops = MIR_insn_nops (ctx, new_insn);
  for (i = 0; i < actual_nops; i++) {
    switch (new_insn->ops[i].mode) {
    case MIR_OP_REG:
      new_insn->ops[i].u.reg = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.reg);
      break;
    case MIR_OP_MEM:
      if (new_insn->ops[i].u.mem.base != 0)
        new_insn->ops[i].u.mem.base
          = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.mem.base);
      if (new_insn->ops[i].u.mem.index != 0)
        new_insn->ops[i].u.mem.index
          = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.mem.index);
      break;
    default: /* do nothing */ break;
    }
  }
}